

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void pointerHandleAxis(void *userData,wl_pointer *pointer,uint32_t time,uint32_t axis,
                      wl_fixed_t value)

{
  int in_ECX;
  wl_fixed_t in_R8D;
  _GLFWwindow *window;
  double in_stack_ffffffffffffffc8;
  _GLFWwindow *p_Var1;
  _GLFWwindow *in_stack_ffffffffffffffd0;
  
  if (_glfw.wl.pointerFocus != (_GLFWwindow *)0x0) {
    if (in_ECX == 1) {
      p_Var1 = _glfw.wl.pointerFocus;
      wl_fixed_to_double(in_R8D);
      _glfwInputScroll(p_Var1,in_stack_ffffffffffffffc8,6.27770333204144e-317);
    }
    else if (in_ECX == 0) {
      p_Var1 = _glfw.wl.pointerFocus;
      wl_fixed_to_double(in_R8D);
      _glfwInputScroll(in_stack_ffffffffffffffd0,(double)p_Var1,6.27773989289924e-317);
    }
  }
  return;
}

Assistant:

static void pointerHandleAxis(void* userData,
                              struct wl_pointer* pointer,
                              uint32_t time,
                              uint32_t axis,
                              wl_fixed_t value)
{
    _GLFWwindow* window = _glfw.wl.pointerFocus;
    if (!window)
        return;

    // NOTE: 10 units of motion per mouse wheel step seems to be a common ratio
    if (axis == WL_POINTER_AXIS_HORIZONTAL_SCROLL)
        _glfwInputScroll(window, -wl_fixed_to_double(value) / 10.0, 0.0);
    else if (axis == WL_POINTER_AXIS_VERTICAL_SCROLL)
        _glfwInputScroll(window, 0.0, -wl_fixed_to_double(value) / 10.0);
}